

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::Decode
          (GED_EnhancedGroundCombatSoldier *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    GED_BasicGroundCombatSoldier::Decode(&this->super_GED_BasicGroundCombatSoldier,stream);
    KDataStream::Read(stream,&this->m_ui8WaterStatus);
    KDataStream::Read(stream,&this->m_ui8RestStatus);
    KDataStream::Read(stream,&this->m_ui8PriAmmun);
    KDataStream::Read(stream,&this->m_ui8SecAmmun);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GED_EnhancedGroundCombatSoldier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_ENHANCED_GROUND_COMBAT_SOLDIER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicGroundCombatSoldier::Decode( stream );

    stream >> m_ui8WaterStatus
           >> m_ui8RestStatus
           >> m_ui8PriAmmun
           >> m_ui8SecAmmun;
}